

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::
TestFactoryImpl<optTyped_nulloptConstructor_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>_>::
CreateTest(TestFactoryImpl<optTyped_nulloptConstructor_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>_>
           *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  *(undefined4 *)&this_00[1]._vptr_Test = 0x10001;
  this_00->_vptr_Test = (_func_int **)&PTR__Test_001fc5f8;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }